

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O1

int enum_ufs(char *dir,char *name,char *ver,FINFO **finfo_buf)

{
  char *__s1;
  finfo *pfVar1;
  int iVar2;
  int *piVar3;
  DIR *__dirp;
  dirent *pdVar4;
  char *pcVar5;
  FINFO *pFVar6;
  FPROP *pFVar7;
  size_t sVar8;
  FINFO *pFVar9;
  char tver [16];
  stat sbuf;
  char pext [255];
  char pname [255];
  char text [255];
  char tname [255];
  char namebuf [4096];
  int local_14fc;
  char local_14d8 [16];
  stat local_14c8;
  char local_1438 [256];
  char local_1338 [256];
  char local_1238 [256];
  char local_1138 [256];
  char local_1038 [4104];
  
  piVar3 = __errno_location();
  *piVar3 = 0;
  alarm(TIMEOUT_TIME);
  do {
    *piVar3 = 0;
    __dirp = opendir(dir);
    if (__dirp != (DIR *)0x0) {
      alarm(0);
      alarm(TIMEOUT_TIME);
      pdVar4 = readdir(__dirp);
      alarm(0);
      pFVar9 = (FINFO *)0x0;
      local_14fc = 0;
      goto LAB_00117fb4;
    }
  } while (*piVar3 == 4);
  alarm(0);
  goto LAB_00117f63;
LAB_00117fb4:
  if (pdVar4 == (dirent *)0x0) {
    if (*piVar3 != 4) {
      closedir(__dirp);
      if (local_14fc < 1) {
        return local_14fc;
      }
      *finfo_buf = pFVar9;
      return local_14fc;
    }
  }
  else {
    __s1 = pdVar4->d_name;
    iVar2 = strcmp(__s1,".");
    if (((iVar2 != 0) && (iVar2 = strcmp(__s1,".."), iVar2 != 0)) && (pdVar4->d_ino != 0)) {
      strcpy(local_1138,__s1);
      strcpy(local_1338,name);
      separate_version(local_1138,local_14d8,0);
      pcVar5 = strrchr(local_1138,0x2e);
      if (pcVar5 == (char *)0x0) {
        local_1238[0] = '\0';
      }
      else {
        *pcVar5 = '\0';
        strcpy(local_1238,pcVar5 + 1);
      }
      pcVar5 = strrchr(local_1338,0x2e);
      if (pcVar5 == (char *)0x0) {
        local_1438[0] = '\0';
      }
      else {
        *pcVar5 = '\0';
        strcpy(local_1438,pcVar5 + 1);
      }
      iVar2 = match_pattern(local_1138,local_1338);
      if (((iVar2 != 0) && (iVar2 = match_pattern(local_1238,local_1438), iVar2 != 0)) &&
         (iVar2 = match_pattern(local_14d8,ver), iVar2 != 0)) {
        if (FreeFinfoList == (FINFO *)0x0) {
          pFVar6 = (FINFO *)calloc(1,0x228);
          if (pFVar6 != (FINFO *)0x0) {
            pFVar7 = (FPROP *)calloc(1,0x118);
            pFVar6->prop = pFVar7;
            if (pFVar7 != (FPROP *)0x0) goto LAB_00118162;
            free(pFVar6);
          }
          pFVar6 = (FINFO *)0x0;
        }
        else {
          pFVar6 = FreeFinfoList;
          FreeFinfoList = FreeFinfoList->next;
        }
LAB_00118162:
        pfVar1 = pFVar9;
        if (pFVar6 == (FINFO *)0x0) goto LAB_001182c4;
        pFVar6->next = pFVar9;
        sprintf(local_1038,"%s/%s",dir,__s1);
        alarm(TIMEOUT_TIME);
        do {
          *piVar3 = 0;
          iVar2 = stat(local_1038,&local_14c8);
          if (iVar2 != -1) {
            alarm(0);
            goto LAB_001181d4;
          }
        } while (*piVar3 == 4);
        alarm(0);
        pfVar1 = pFVar6;
        if (*piVar3 != 2) goto LAB_001182ed;
LAB_001181d4:
        strcpy(local_1038,__s1);
        if ((local_14c8.st_mode & 0xf000) == 0x4000) {
          pFVar6->dirp = 1;
          quote_dname(local_1038);
          strcpy(pFVar6->lname,local_1038);
          sVar8 = strlen(local_1038);
          (pFVar6->lname + sVar8)[0] = '>';
          (pFVar6->lname + sVar8)[1] = '\0';
          sVar8 = sVar8 + 1;
        }
        else {
          pFVar6->dirp = 0;
          quote_fname_ufs(local_1038);
          sVar8 = strlen(local_1038);
          strcpy(pFVar6->lname,local_1038);
          pFVar6->lname[sVar8] = '\0';
        }
        pFVar6->lname_len = sVar8;
        strcpy(local_1038,__s1);
        pFVar6->ino = local_14c8.st_ino;
        local_14fc = local_14fc + 1;
        pFVar9 = pFVar6;
      }
    }
  }
  *piVar3 = 0;
  alarm(TIMEOUT_TIME);
  pdVar4 = readdir(__dirp);
  alarm(0);
  goto LAB_00117fb4;
LAB_001182c4:
  do {
    pFVar6 = pfVar1;
    pfVar1 = pFVar6->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar6->next = FreeFinfoList;
  FreeFinfoList = pFVar9;
  goto LAB_00118311;
LAB_001182ed:
  do {
    pFVar9 = pfVar1;
    pfVar1 = pFVar9->next;
  } while (pfVar1 != (finfo *)0x0);
  pFVar9->next = FreeFinfoList;
  FreeFinfoList = pFVar6;
LAB_00118311:
  closedir(__dirp);
LAB_00117f63:
  *Lisp_errno = *piVar3;
  return -1;
}

Assistant:

static int enum_ufs(char *dir, char *name, char *ver, FINFO **finfo_buf)
{
  struct dirent *dp;
  FINFO *prevp;
  FINFO *nextp;
  int n, rval;
  size_t len;
  DIR *dirp;
  struct stat sbuf;
  char namebuf[MAXPATHLEN];

  errno = 0;
  TIMEOUT0(dirp = opendir(dir));
  if (dirp == NULL) {
    *Lisp_errno = errno;
    return (-1);
  }

  for (S_TOUT(dp = readdir(dirp)), nextp = prevp = (FINFO *)NULL, n = 0;
       dp != (struct dirent *)NULL || errno == EINTR;
       errno = 0, S_TOUT(dp = readdir(dirp)), prevp = nextp)
    if (dp) {
      if (strcmp(dp->d_name, ".") == 0 || strcmp(dp->d_name, "..") == 0 || dp->d_ino == 0) continue;
      MatchP_Case((char *)dp->d_name, name, ver, match, unmatch);
    unmatch:
      continue;
    match:
      AllocFinfo(nextp);
      if (nextp == (FINFO *)NULL) {
        FreeFinfo(prevp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }
      nextp->next = prevp;
      sprintf(namebuf, "%s/%s", dir, dp->d_name);
      TIMEOUT(rval = stat(namebuf, &sbuf));
      if (rval == -1 && errno != ENOENT) {
        /*
         * ENOENT error might be caused by missing symbolic
         * link. We should ignore such error here.
         */
        FreeFinfo(nextp);
        closedir(dirp);
        *Lisp_errno = errno;
        return (-1);
      }

      strcpy(namebuf, dp->d_name);
      if (S_ISDIR(sbuf.st_mode)) {
        nextp->dirp = 1;
        quote_dname(namebuf);
        strcpy(nextp->lname, namebuf);
        len = strlen(namebuf);
        *(nextp->lname + len) = DIRCHAR;
        *(nextp->lname + len + 1) = '\0';
        nextp->lname_len = len + 1;
      } else {
        /* All other types than directory. */
        nextp->dirp = 0;
        quote_fname_ufs(namebuf);
        len = strlen(namebuf);
        strcpy(nextp->lname, namebuf);
        *(nextp->lname + len) = '\0';
        nextp->lname_len = len;
      }

      strcpy(namebuf, dp->d_name);
      len = strlen(namebuf);
      nextp->ino = sbuf.st_ino;
      n++;
    }
  closedir(dirp);
  if (n > 0) *finfo_buf = prevp;
  return (n);
}